

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

DynamicTypeHandler * __thiscall
Js::PathTypeHandlerBase::ConvertToTypeWithItemAttributes
          (PathTypeHandlerBase *this,DynamicObject *instance)

{
  int *piVar1;
  bool bVar2;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar3;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar4;
  
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->
            convertPathToDictionaryItemAttributesCount;
  *piVar1 = *piVar1 + 1;
  bVar2 = JavascriptArray::IsNonES5Array(instance);
  if (bVar2) {
    pEVar3 = ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>(this,instance);
    return (DynamicTypeHandler *)pEVar3;
  }
  pDVar4 = ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>(this,instance);
  return &pDVar4->super_DynamicTypeHandler;
}

Assistant:

DynamicTypeHandler* PathTypeHandlerBase::ConvertToTypeWithItemAttributes(DynamicObject* instance)
    {
#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertPathToDictionaryItemAttributesCount++;
#endif
        return JavascriptArray::IsNonES5Array(instance) ?
            ConvertToES5ArrayType(instance) : ConvertToDictionaryType(instance);
    }